

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O2

void __thiscall InterleavedSudoku::permuteNumbers(InterleavedSudoku *this)

{
  Field *pFVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int x;
  int iVar6;
  int i;
  long lVar7;
  vector<int,_std::allocator<int>_> permutation;
  allocator_type local_39;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,(long)(this->super_Sudoku).squared_size_
             ,&local_39);
  lVar7 = 0;
  while (uVar4 = (ulong)(this->super_Sudoku).squared_size_, lVar7 < (long)uVar4) {
    local_38._M_impl.super__Vector_impl_data._M_start[lVar7] = (int)(lVar7 + 1);
    lVar7 = lVar7 + 1;
  }
  iVar6 = 0;
  for (lVar7 = 0; lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
    iVar2 = rand();
    lVar5 = iVar2 % ((this->super_Sudoku).squared_size_ + iVar6) + lVar7;
    iVar2 = local_38._M_impl.super__Vector_impl_data._M_start[lVar7];
    local_38._M_impl.super__Vector_impl_data._M_start[lVar7] =
         local_38._M_impl.super__Vector_impl_data._M_start[lVar5];
    local_38._M_impl.super__Vector_impl_data._M_start[lVar5] = iVar2;
    uVar4 = (ulong)(uint)(this->super_Sudoku).squared_size_;
    iVar6 = iVar6 + -1;
  }
  for (iVar6 = 0; iVar6 < (int)uVar4; iVar6 = iVar6 + 1) {
    for (iVar2 = 0; iVar2 < (int)uVar4; iVar2 = iVar2 + 1) {
      iVar3 = Field::value((this->super_Sudoku).fields_.
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar4 * iVar2 + iVar6].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (0 < iVar3) {
        pFVar1 = (this->super_Sudoku).fields_.
                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [(this->super_Sudoku).squared_size_ * iVar2 + iVar6].
                 super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar3 = Field::value(pFVar1);
        Field::setValue(pFVar1,local_38._M_impl.super__Vector_impl_data._M_start[(long)iVar3 + -1]);
      }
      iVar3 = (this->super_Sudoku).squared_size_;
      iVar3 = Field::value((this->super_Sudoku).fields_.
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [(iVar2 + iVar3) * iVar3 + iVar6].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (0 < iVar3) {
        iVar3 = (this->super_Sudoku).squared_size_;
        pFVar1 = (this->super_Sudoku).fields_.
                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(iVar2 + iVar3) * iVar3 + iVar6].
                 super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar3 = Field::value(pFVar1);
        Field::setValue(pFVar1,local_38._M_impl.super__Vector_impl_data._M_start[(long)iVar3 + -1]);
      }
      uVar4 = (ulong)(uint)(this->super_Sudoku).squared_size_;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void InterleavedSudoku::permuteNumbers()
{
  //generate random permutation
  //srand(std::time(NULL));
  std::vector<int> permutation(squared_size_);
  for(int i=0; i<squared_size_; i++)
  {
    permutation[i] = i+1;
  }

  for(int i=0; i<squared_size_; i++)
  {
    int index = rand() % (squared_size_-i) + i;
    std::swap(permutation[i], permutation[index]);
  }

  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      if(fields_[index(x,y,0)]->value() > 0)
        fields_[index(x,y,0)]->setValue(permutation[fields_[index(x,y,0)]->value()-1]);
      if(fields_[index(x,y,1)]->value() > 0)
        fields_[index(x,y,1)]->setValue(permutation[fields_[index(x,y,1)]->value()-1]);
    }
  }
}